

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O2

void __thiscall
QPDF::JSONReactor::setObjectDescription(JSONReactor *this,QPDFObjectHandle *oh,JSON *value)

{
  QPDFObject *this_00;
  QPDF *qpdf_p;
  bool bVar1;
  variant_alternative_t<1UL,_variant<basic_string<char>,_JSON_Descr,_ChildDescr,_ObjStreamDescr>_>
  *pvVar2;
  qpdf_offset_t offset;
  JSON_Descr j_descr;
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  local_b0;
  undefined1 local_a0 [16];
  JSON_Descr local_90;
  JSON_Descr local_60;
  
  pvVar2 = std::
           get<1ul,std::__cxx11::string,QPDFObject::JSON_Descr,QPDFObject::ChildDescr,QPDFObject::ObjStreamDescr>
                     ((this->descr).
                      super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
  QPDFObject::JSON_Descr::JSON_Descr((JSON_Descr *)(local_a0 + 0x10),pvVar2);
  bVar1 = std::operator!=(&local_90.object,&this->cur_object);
  if (bVar1) {
    std::
    __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_b0,
                   (__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    *)(local_a0 + 0x10));
    QPDFObject::JSON_Descr::JSON_Descr
              (&local_60,
               (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_b0,&this->cur_object);
    std::
    make_shared<std::variant<std::__cxx11::string,QPDFObject::JSON_Descr,QPDFObject::ChildDescr,QPDFObject::ObjStreamDescr>,QPDFObject::JSON_Descr>
              ((JSON_Descr *)local_a0);
    std::
    __shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=(&(this->descr).
                 super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
                ,(__shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
                  *)local_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
    QPDFObject::JSON_Descr::~JSON_Descr(&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
  }
  this_00 = (oh->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  qpdf_p = this->pdf;
  offset = JSON::getStart(value);
  QPDFObject::setDescription(this_00,qpdf_p,&this->descr,offset);
  QPDFObject::JSON_Descr::~JSON_Descr((JSON_Descr *)(local_a0 + 0x10));
  return;
}

Assistant:

void
QPDF::JSONReactor::setObjectDescription(QPDFObjectHandle& oh, JSON const& value)
{
    auto j_descr = std::get<QPDFObject::JSON_Descr>(*descr);
    if (j_descr.object != cur_object) {
        descr = std::make_shared<QPDFObject::Description>(
            QPDFObject::JSON_Descr(j_descr.input, cur_object));
    }

    oh.getObjectPtr()->setDescription(&pdf, descr, value.getStart());
}